

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSLSocket.cpp
# Opt level: O0

int __thiscall blc::network::SSLSocket::open(SSLSocket *this,char *__file,int __oflag,...)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  in_addr_t iVar4;
  int iVar5;
  uint uVar6;
  undefined8 uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  int *piVar8;
  char *pcVar9;
  SSL_METHOD *meth_00;
  SSL_CTX *ctx_00;
  SSL *pSVar10;
  SSL_CTX *ctx;
  SSL_METHOD *meth;
  int i;
  in_addr **addr_list;
  hostent *he;
  sockaddr_in addr;
  char *in_stack_fffffffffffffba8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf0;
  undefined8 in_stack_fffffffffffffbf8;
  string *in_stack_fffffffffffffd88;
  exception *in_stack_fffffffffffffd90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_251 [7];
  char **local_170;
  hostent *local_168;
  undefined1 local_159;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_131 [7];
  undefined1 local_4d;
  sockaddr local_18;
  SSLSocket *local_8;
  
  iVar5 = (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20);
  local_8 = this;
  bVar1 = std::operator==(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  if ((bVar1) || (this->_port == 0)) {
    local_4d = 1;
    uVar7 = __cxa_allocate_exception(0x78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8,
               (allocator<char> *)in_stack_fffffffffffffbe0);
    error::exception::exception(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    local_4d = 0;
    __cxa_throw(uVar7,&error::exception::typeinfo,error::exception::~exception);
  }
  if ((this->_opened & 1U) == 1) {
    bVar2 = 1;
  }
  else {
    iVar3 = socket(this->_type,this->_mode | (1 - (uint)(this->_block & 1)) * 0x800,0);
    *(int *)&(this->super_Socket).field_0x44 = iVar3;
    if (*(int *)&(this->super_Socket).field_0x44 == -1) {
      local_159 = 1;
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x78);
      pbVar11 = local_131;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (pbVar11,(char *)__lhs,(allocator<char> *)in_stack_fffffffffffffbe0);
      std::operator+(in_stack_fffffffffffffbb8,(char *)in_stack_fffffffffffffbb0);
      std::operator+(in_stack_fffffffffffffbb8,(char *)in_stack_fffffffffffffbb0);
      std::operator+(in_stack_fffffffffffffbb8,(char *)in_stack_fffffffffffffbb0);
      std::__cxx11::to_string(iVar5);
      std::operator+(__lhs,in_stack_fffffffffffffbe0);
      std::operator+(in_stack_fffffffffffffbb8,(char *)in_stack_fffffffffffffbb0);
      piVar8 = __errno_location();
      strerror(*piVar8);
      std::operator+(in_stack_fffffffffffffbb8,(char *)in_stack_fffffffffffffbb0);
      error::exception::exception(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      local_159 = 0;
      __cxa_throw(__lhs,&error::exception::typeinfo,error::exception::~exception);
    }
    local_18.sa_family = 2;
    local_18.sa_data._0_2_ = htons((uint16_t)this->_port);
    pcVar9 = (char *)std::__cxx11::string::c_str();
    local_18.sa_data._2_4_ = inet_addr(pcVar9);
    pcVar9 = (char *)std::__cxx11::string::c_str();
    iVar4 = inet_addr(pcVar9);
    if (iVar4 == 0xffffffff) {
      pcVar9 = (char *)std::__cxx11::string::c_str();
      local_168 = gethostbyname(pcVar9);
      if (local_168 == (hostent *)0x0) {
        uVar7 = __cxa_allocate_exception(0x78);
        pbVar11 = local_251;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8,
                   (allocator<char> *)pbVar11);
        std::operator+(in_stack_fffffffffffffbb8,(char *)in_stack_fffffffffffffbb0);
        std::operator+(in_stack_fffffffffffffbb8,(char *)in_stack_fffffffffffffbb0);
        std::operator+(in_stack_fffffffffffffbb8,(char *)in_stack_fffffffffffffbb0);
        std::__cxx11::to_string(iVar5);
        std::operator+(in_stack_fffffffffffffbe8,pbVar11);
        std::operator+(in_stack_fffffffffffffbb8,(char *)in_stack_fffffffffffffbb0);
        piVar8 = __errno_location();
        strerror(*piVar8);
        std::operator+(in_stack_fffffffffffffbb8,(char *)in_stack_fffffffffffffbb0);
        error::exception::exception(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
        __cxa_throw(uVar7,&error::exception::typeinfo,error::exception::~exception);
      }
      local_170 = local_168->h_addr_list;
      if (*local_170 != (char *)0x0) {
        local_18.sa_data._2_4_ = *(undefined4 *)*local_170;
      }
    }
    iVar3 = connect(*(int *)&(this->super_Socket).field_0x44,&local_18,0x10);
    if ((iVar3 < 0) && (piVar8 = __errno_location(), *piVar8 != 0x73)) {
      uVar7 = __cxa_allocate_exception(0x78);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8,
                 (allocator<char> *)in_stack_fffffffffffffbe0);
      std::operator+(in_stack_fffffffffffffbb8,(char *)in_stack_fffffffffffffbb0);
      std::operator+(in_stack_fffffffffffffbb8,(char *)in_stack_fffffffffffffbb0);
      std::operator+(in_stack_fffffffffffffbb8,(char *)in_stack_fffffffffffffbb0);
      std::__cxx11::to_string(iVar5);
      std::operator+(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
      std::operator+(in_stack_fffffffffffffbb8,(char *)in_stack_fffffffffffffbb0);
      piVar8 = __errno_location();
      strerror(*piVar8);
      std::operator+(in_stack_fffffffffffffbb8,(char *)in_stack_fffffffffffffbb0);
      error::exception::exception(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      __cxa_throw(uVar7,&error::exception::typeinfo,error::exception::~exception);
    }
    this->_opened = true;
    meth_00 = (SSL_METHOD *)TLS_client_method();
    ctx_00 = SSL_CTX_new(meth_00);
    pSVar10 = SSL_new(ctx_00);
    this->_ssl = (SSL *)pSVar10;
    if (this->_ssl == (SSL *)0x0) {
      log_ssl();
      uVar7 = __cxa_allocate_exception(0x78);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8,
                 (allocator<char> *)in_stack_fffffffffffffbe0);
      error::exception::exception(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      __cxa_throw(uVar7,&error::exception::typeinfo,error::exception::~exception);
    }
    SSL_get_fd((SSL *)this->_ssl);
    SSL_set_fd((SSL *)this->_ssl,*(int *)&(this->super_Socket).field_0x44);
    iVar5 = SSL_connect((SSL *)this->_ssl);
    if (iVar5 < 1) {
      log_ssl();
      uVar7 = __cxa_allocate_exception(0x78);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8,
                 (allocator<char> *)in_stack_fffffffffffffbe0);
      error::exception::exception(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      __cxa_throw(uVar7,&error::exception::typeinfo,error::exception::~exception);
    }
    do {
      uVar6 = (*(this->super_Socket).super_stream._vptr_stream[5])();
      bVar2 = (byte)uVar6 & 1;
    } while ((uVar6 & 1) == 0);
  }
  return (uint)bVar2;
}

Assistant:

void blc::network::SSLSocket::open() {
	struct sockaddr_in addr;

	if (this->_address == "" || this->_port == 0)
		throw blc::error::exception("non set connection");
	else if (this->_opened == true)
		return;
	this->_socket = ::socket(this->_type, this->_mode | (SOCK_NONBLOCK * (1 - this->_block)), 0);
	if (this->_socket == -1)
		throw blc::error::exception(assertError(strerror(errno)));
	#ifdef __WIN32
		u_long mode = !this->_block;
		ioctlsocket(this->_socket, FIONBIO, &mode);
	#endif
	addr.sin_family = AF_INET;
	addr.sin_port = htons(this->_port);
	addr.sin_addr.s_addr = inet_addr(this->_address.c_str());
	if(inet_addr(this->_address.c_str()) == INADDR_NONE) {
		struct hostent *he;
		struct in_addr **addr_list;
		if ( (he = gethostbyname( this->_address.c_str() ) ) == NULL)
			throw blc::error::exception(assertError(strerror(errno)));
		addr_list = (struct in_addr **) he->h_addr_list;
		for(int i = 0; addr_list[i] != NULL; i++) {
			addr.sin_addr = *addr_list[i];
			break;
		}
	}
	if (connect(this->_socket, (struct sockaddr *)&addr, sizeof(addr)) < 0 && errno != EINPROGRESS)
		throw blc::error::exception(assertError(strerror(errno)));
	this->_opened = true;
	const SSL_METHOD *meth = SSLv23_client_method();
	SSL_CTX *ctx = SSL_CTX_new (meth);
	this->_ssl = SSL_new (ctx);
	if (!this->_ssl) {
		log_ssl();
		throw blc::error::exception("Error creating SSL");
	}
	SSL_get_fd(this->_ssl);
	SSL_set_fd(this->_ssl, this->_socket);
	if (SSL_connect(this->_ssl) <= 0) {
		log_ssl();
		throw blc::error::exception("Error creating SSL connection");
	}
	while (this->writable() == false) continue;
}